

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

void rd_4dim_slice(char **content,size_t *line_no,int *array,int *dim,int *shift,int *post)

{
  int iVar1;
  
  iVar1 = *shift;
  if (*post + post[1] + post[2] + post[3] + shift[1] + iVar1 + shift[2] + shift[3] == 0) {
    rd_1dim_slice(content,line_no,array,*dim * dim[1] * dim[2] * dim[3],0,0);
    return;
  }
  if (iVar1 < *dim - *post) {
    do {
      rd_3dim_slice(content,line_no,array + (long)dim[3] * (long)dim[2] * (long)dim[1] * (long)iVar1
                    ,dim + 1,shift + 1,post + 1);
      iVar1 = iVar1 + 1;
    } while (iVar1 < *dim - *post);
  }
  return;
}

Assistant:

PRIVATE void
rd_4dim_slice(char    **content,
              size_t  *line_no,
              int     *array,
              int     dim[4],
              int     shift[4],
              int     post[4])
{
  int i;
  int delta_pre   = shift[0] + shift[1] + shift[2] + shift[3];
  int delta_post  = post[0] + post[1] + post[2] + post[3];

  if (delta_pre + delta_post == 0) {
    rd_1dim(content, line_no, array, dim[0] * dim[1] * dim[2] * dim[3], 0);
    return;
  }

  for (i = shift[0]; i < dim[0] - post[0]; i++) {
    rd_3dim_slice(content, line_no, array + (i * dim[1] * dim[2] * dim[3]),
                  dim + 1,
                  shift + 1,
                  post + 1);
  }
  return;
}